

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManCutMap(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Ptr_t *vSupps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  Aig_Obj_t *pAVar8;
  void *__ptr;
  void *__ptr_00;
  void *pvVar9;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int iVar10;
  char *__format;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  
  p_00 = Vec_PtrAlloc(100);
  for (iVar10 = 0; iVar10 < vResult->nSize; iVar10 = iVar10 + 1) {
    pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(vResult,iVar10);
    pVVar7 = Vec_IntStart(p->vObjs->nSize);
    for (iVar12 = 0; iVar12 < pVVar6->nSize; iVar12 = iVar12 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,iVar12);
      iVar1 = Saig_ObjIsPi(p,pAVar8);
      if (iVar1 == 0) {
        Vec_IntWriteEntry(pVVar7,pAVar8->Id,1);
      }
    }
    Vec_PtrPush(p_00,pVVar7);
  }
  pVVar7 = Vec_IntStart(p->vObjs->nSize);
  Vec_PtrPush(p_00,pVVar7);
  iVar10 = p_00->nSize;
  if (iVar10 != vResult->nSize + 1) {
    __assert_fail("Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                  ,0x72,"Vec_Ptr_t *Llb_ManCutMap(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  uVar15 = (ulong)p->nTruePis;
  __ptr = malloc(uVar15 << 2);
  __ptr_00 = malloc(uVar15 << 2);
  for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
    Vec_PtrEntry(p->vCis,(int)lVar14);
    *(undefined4 *)((long)__ptr_00 + lVar14 * 4) = 0xffffffff;
    *(undefined4 *)((long)__ptr + lVar14 * 4) = 0xffffffff;
    uVar15 = (ulong)(uint)p->nTruePis;
  }
  for (iVar12 = 0; iVar12 < vSupps->nSize; iVar12 = iVar12 + 1) {
    pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(vSupps,iVar12);
    for (iVar1 = 0; iVar1 < pVVar6->nSize; iVar1 = iVar1 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,iVar1);
      iVar2 = Saig_ObjIsPi(p,pAVar8);
      if (iVar2 != 0) {
        iVar2 = Aig_ObjCioId(pAVar8);
        if (*(int *)((long)__ptr + (long)iVar2 * 4) == -1) {
          iVar2 = Aig_ObjCioId(pAVar8);
          *(int *)((long)__ptr + (long)iVar2 * 4) = iVar12;
        }
        iVar2 = Aig_ObjCioId(pAVar8);
        *(int *)((long)__ptr_00 + (long)iVar2 * 4) = iVar12;
      }
    }
  }
  for (iVar12 = 0; iVar12 < p->nRegs; iVar12 = iVar12 + 1) {
    pvVar9 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar12);
    iVar1 = Saig_ObjIsPi(p,(Aig_Obj_t *)(*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe));
    if (iVar1 != 0) {
      iVar1 = Aig_ObjCioId((Aig_Obj_t *)(*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe));
      *(int *)((long)__ptr_00 + (long)iVar1 * 4) = iVar10 + -1;
    }
  }
  uVar15 = 1;
  for (lVar14 = 0; lVar14 < p->nTruePis; lVar14 = lVar14 + 1) {
    pvVar9 = Vec_PtrEntry(p->vCis,(int)lVar14);
    iVar12 = *(int *)((long)__ptr + lVar14 * 4);
    if (iVar12 != -1) {
      iVar1 = *(int *)((long)__ptr_00 + lVar14 * 4);
      if (iVar12 == iVar1) {
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar12);
        Vec_IntWriteEntry(pVVar7,*(int *)((long)pvVar9 + 0x24),2);
      }
      else {
        for (; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
          pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar12);
          Vec_IntWriteEntry(pVVar7,*(int *)((long)pvVar9 + 0x24),1);
        }
      }
    }
  }
  free(__ptr);
  free(__ptr_00);
  uVar11 = p->nRegs;
  printf("%d ",(ulong)uVar11);
  while (iVar12 = (int)uVar15, iVar12 < iVar10) {
    pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar12);
    p_01 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar12 + -1);
    if (iVar12 == iVar10 + -1) {
      p_02 = (Vec_Int_t *)0x0;
    }
    else {
      p_02 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar12 + 1);
    }
    iVar1 = 0;
    iVar2 = 0;
    for (iVar13 = 0; iVar13 < p->vObjs->nSize; iVar13 = iVar13 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar13);
      if (pAVar8 != (Aig_Obj_t *)0x0) {
        iVar3 = Saig_ObjIsPi(p,pAVar8);
        iVar4 = Vec_IntEntry(p_01,iVar13);
        if (iVar3 == 0) {
          if (iVar4 == 0) {
            iVar3 = Vec_IntEntry(pVVar7,iVar13);
            iVar1 = iVar1 + (uint)(iVar3 == 1);
          }
          iVar3 = Vec_IntEntry(p_01,iVar13);
          if (iVar3 == 1) {
            iVar3 = Vec_IntEntry(pVVar7,iVar13);
            iVar2 = iVar2 + (uint)(iVar3 == 0);
          }
        }
        else {
          if (iVar4 == 0) {
            iVar3 = Vec_IntEntry(pVVar7,iVar13);
            iVar1 = iVar1 + (uint)(iVar3 == 1);
          }
          iVar3 = Vec_IntEntry(pVVar7,iVar13);
          if ((iVar3 == 1) &&
             ((p_02 == (Vec_Int_t *)0x0 || (iVar3 = Vec_IntEntry(p_02,iVar13), iVar3 == 0)))) {
            iVar2 = iVar2 + 1;
          }
        }
      }
    }
    uVar11 = (uVar11 + iVar1) - iVar2;
    printf("%d=%d ",uVar15,(ulong)uVar11);
    uVar15 = (ulong)(iVar12 + 1);
  }
  putchar(10);
  iVar12 = 0;
  if (0 < iVar10) {
    iVar12 = iVar10;
  }
  uVar11 = 0;
  do {
    if (p->vObjs->nSize <= (int)uVar11) {
      return p_00;
    }
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,uVar11);
    if ((pAVar8 != (Aig_Obj_t *)0x0) &&
       ((uVar5 = (uint)*(undefined8 *)&pAVar8->field_0x18, (uVar5 & 7) == 2 ||
        (0xfffffffd < (uVar5 & 7) - 7)))) {
      for (iVar1 = 0; iVar2 = iVar12, iVar12 != iVar1; iVar1 = iVar1 + 1) {
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar1);
        iVar13 = Vec_IntEntry(pVVar7,uVar11);
        iVar2 = iVar1;
        if (iVar13 != 0) break;
      }
      if (iVar2 != iVar10) {
        printf("Obj = %4d : ",(ulong)uVar11);
        iVar1 = Saig_ObjIsPi(p,pAVar8);
        __format = "pi  ";
        if (iVar1 == 0) {
          iVar1 = Saig_ObjIsLo(p,pAVar8);
          __format = "lo  ";
          if ((iVar1 != 0) ||
             (__format = "and ", 0xfffffffd < (*(uint *)&pAVar8->field_0x18 & 7) - 7))
          goto LAB_00696ddd;
        }
        else {
LAB_00696ddd:
          printf(__format);
        }
        for (iVar1 = 0; iVar12 != iVar1; iVar1 = iVar1 + 1) {
          pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar1);
          uVar5 = Vec_IntEntry(pVVar7,uVar11);
          printf("%d",(ulong)uVar5);
        }
        putchar(10);
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManCutMap( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Ptr_t * vSupps )
{
    int fShowMatrix = 1;
    Vec_Ptr_t * vMaps, * vOne;
    Vec_Int_t * vMap, * vPrev, * vNext;
    Aig_Obj_t * pObj;
    int * piFirst, * piLast;
    int i, k, CounterPlus, CounterMinus, Counter;

    vMaps = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vResult, vOne, i )
    {
        vMap = Vec_IntStart( Aig_ManObjNumMax(p) );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                Vec_IntWriteEntry( vMap, pObj->Id, 1 );
//            else
//printf( "*" );
//printf( "%d ", pObj->Id );
        }
        Vec_PtrPush( vMaps, vMap );
//printf( "\n" );
    }
    Vec_PtrPush( vMaps, Vec_IntStart( Aig_ManObjNumMax(p) ) );
    assert( Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1 );

    // collect the first and last PIs
    piFirst = ABC_ALLOC( int, Saig_ManPiNum(p) );
    piLast  = ABC_ALLOC( int, Saig_ManPiNum(p) );
    Saig_ManForEachPi( p, pObj, i )
        piFirst[i] = piLast[i] = -1;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSupps, vOne, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                continue;
            if ( piFirst[Aig_ObjCioId(pObj)] == -1 )
                 piFirst[Aig_ObjCioId(pObj)] = i;
            piLast[Aig_ObjCioId(pObj)] = i;
        }
    }
    // PIs feeding into the flops should be extended to the last frame
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Saig_ObjIsPi(p, Aig_ObjFanin0(pObj)) )
            continue;
        piLast[Aig_ObjCioId(Aig_ObjFanin0(pObj))] = Vec_PtrSize(vMaps)-1;
    }

    // set the PI map
    Saig_ManForEachPi( p, pObj, i )
    {
        if ( piFirst[i] == -1 )
            continue;
        if ( piFirst[i] == piLast[i] )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, piFirst[i] );
            Vec_IntWriteEntry( vMap, pObj->Id, 2 );
            continue;
        }

        // set support for all in between        
        for ( k = piFirst[i]; k <= piLast[i]; k++ )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, k );
            Vec_IntWriteEntry( vMap, pObj->Id, 1 );
        }
    }
    ABC_FREE( piFirst );
    ABC_FREE( piLast );


    // find all that will appear here
    Counter = Aig_ManRegNum(p);
    printf( "%d ", Counter );
    Vec_PtrForEachEntryStart( Vec_Int_t *, vMaps, vMap, i, 1 )
    {
        vPrev = (Vec_Int_t *)Vec_PtrEntry( vMaps, i-1 );
        vNext = (i == Vec_PtrSize(vMaps)-1)? NULL: (Vec_Int_t *)Vec_PtrEntry( vMaps, i+1 );

        CounterPlus = CounterMinus = 0;
        Aig_ManForEachObj( p, pObj, k )
        {
            if ( Saig_ObjIsPi(p, pObj) )
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vMap, k) == 1 && (vNext == NULL || Vec_IntEntry(vNext, k) == 0) )
                    CounterMinus++;
            }
            else
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vPrev, k) == 1 && Vec_IntEntry(vMap, k) == 0 )
                    CounterMinus++;
            }
        }
        Counter = Counter + CounterPlus - CounterMinus;
        printf( "%d=%d ", i, Counter );
    }
    printf( "\n" );

    if ( !fShowMatrix )
        return vMaps;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            if ( Vec_IntEntry(vMap, i) )
                break;
        if ( k == Vec_PtrSize(vMaps) )
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );

        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            printf( "%d", Vec_IntEntry(vMap, i) );
        printf( "\n" );
    }
    return vMaps;
}